

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBruteForceSearch.h
# Opt level: O1

double __thiscall
BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve
          (BGIP_SolverBruteForceSearch<JointPolicyPureVector> *this)

{
  int *piVar1;
  undefined1 *puVar2;
  shared_ptr<JointPolicyDiscretePure> sVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long *plVar6;
  undefined1 auVar7 [16];
  char cVar8;
  Interface_ProblemToPolicyDiscretePure *this_00;
  bool bVar9;
  JointPolicyPureVector *pJVar10;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  LIndex LVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  undefined8 *in_RCX;
  __time_t extraout_RDX;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  ulong uVar23;
  double dVar24;
  undefined1 auVar25 [64];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  timeval tVar29;
  timeval tVar30;
  shared_ptr<JointPolicyPureVector> jpol;
  shared_ptr<JointPolicyPureVector> best;
  timeval start_time;
  EDeadline e;
  tms ts_after;
  tms ts_before;
  stringstream ss;
  double local_2d0;
  double local_2c0;
  ulong local_2b8;
  JointPolicyPureVector *local_2a0;
  shared_count local_298;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> *local_290;
  JointPolicyPureVector *local_288;
  shared_count local_280;
  long local_278;
  __suseconds_t local_270;
  __time_t local_268;
  double local_260;
  string local_258;
  timeval local_238;
  EDeadline local_228;
  tms local_1f8;
  tms local_1d8;
  shared_ptr<JointPolicyDiscretePure> local_1b8;
  ostream local_1a8 [376];
  undefined1 extraout_var [56];
  
  this->_m_solved = true;
  iVar11 = gettimeofday(&local_238,(__timezone_ptr_t)0x0);
  if (iVar11 != 0) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar19 = "Error with gettimeofday";
    __cxa_throw(puVar19,&char_const*::typeinfo,0);
  }
  times(&local_1d8);
  (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface + 0x38))(&local_1b8,this);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&local_2a0,&local_1b8);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface + 0x38))(&local_1b8,this);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&local_288,&local_1b8);
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  lVar15 = *(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                     super_BGIP_IncrementalSolverInterface.field_0x10;
  local_1b8.px = *(element_type **)
                  &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                   super_BGIP_IncrementalSolverInterface.field_0x8;
  local_1b8.pn.pi_ =
       *(sp_counted_base **)
        &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
         super_BGIP_IncrementalSolverInterface.field_0x10;
  if (lVar15 != 0) {
    LOCK();
    piVar1 = (int *)(lVar15 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  uVar14 = BayesianGameBase::GetNrJointTypes();
  boost::detail::shared_count::~shared_count(&local_1b8.pn);
  uVar5 = *(ulong *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                     super_BGIP_IncrementalSolverInterface.field_0x30;
  local_278 = local_1d8.tms_utime;
  local_268 = local_238.tv_sec;
  local_270 = local_238.tv_usec;
  puVar2 = &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
            super_BGIP_IncrementalSolverInterface.field_0x18;
  local_2b8 = 1000000;
  local_2c0 = -1.79769313486232e+308;
  uVar21 = 0;
  uVar13 = 0;
  local_290 = this;
  do {
    if ((uVar13 & 1) != 0) {
      if ((this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
          super_BGIP_IncrementalSolverInterface.field_0xc8 == '\x01') {
        plVar6 = *(long **)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                            super_BGIP_IncrementalSolverInterface.field_0xd0;
        cVar8 = (char)plVar6;
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        plVar6 = *(long **)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                            super_BGIP_IncrementalSolverInterface.field_0xd8;
        cVar8 = (char)plVar6;
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
      }
      if (uVar5 == 1) {
        BGIPSolution::AddSolution((JointPolicyPureVector *)puVar2,local_2c0);
        local_2d0 = local_2c0;
      }
      else {
        local_2d0 = local_2c0;
      }
      break;
    }
    if ((this->_m_deadlineInSeconds != 0) && (uVar21 % local_2b8 == 0)) {
      times(&local_1f8);
      lVar15 = local_1f8.tms_utime - local_278;
      lVar16 = sysconf(2);
      dVar26 = (double)lVar15 / (double)lVar16;
      if (2.0 <= dVar26) {
        lVar15 = *(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                           super_BGIP_IncrementalSolverInterface.field_0x10;
        this_00 = *(Interface_ProblemToPolicyDiscretePure **)
                   &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                    super_BGIP_IncrementalSolverInterface.field_0x8;
        local_1b8.px = *(element_type **)
                        &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface.field_0x8;
        local_1b8.pn.pi_ =
             *(sp_counted_base **)
              &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
               super_BGIP_IncrementalSolverInterface.field_0x10;
        if (lVar15 != 0) {
          LOCK();
          piVar1 = (int *)(lVar15 + 8);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        LVar17 = Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies
                           (this_00,TYPE_INDEX,999999);
        boost::detail::shared_count::~shared_count(&local_1b8.pn);
        dVar24 = (double)Globals::CastLIndexToDouble(LVar17);
        dVar22 = (double)Globals::CastLIndexToDouble(local_2b8);
        dVar24 = (dVar24 / dVar22) * dVar26;
        auVar7._8_8_ = in_XMM2_Qb;
        auVar7._0_8_ = in_XMM2_Qa;
        auVar7 = vcvtusi2sd_avx512f(auVar7,this->_m_deadlineInSeconds);
        if (auVar7._0_8_ * 1.5 < dVar24) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"BGIP_SolverBruteForceSearch::Solve after ",0x29);
          poVar18 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18," we spent ",10);
          poVar18 = std::ostream::_M_insert<double>(dVar26);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"s, for all ",0xb);
          poVar18 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18," jpols we expect to take ",0x19);
          poVar18 = std::ostream::_M_insert<double>(dVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"s, which is above the deadline (>1.5*",0x25);
          poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"s), bailing out",0xf);
          std::__cxx11::stringbuf::str();
          EDeadline::EDeadline(&local_228,&local_258,dVar24);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          puVar19 = (undefined8 *)__cxa_allocate_exception(0x30);
          *puVar19 = &PTR__E_00134c98;
          puVar19[1] = puVar19 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar19 + 1),local_228.super_E._m_error._M_dataplus._M_p,
                     local_228.super_E._m_error._M_dataplus._M_p +
                     local_228.super_E._m_error._M_string_length);
          *puVar19 = &PTR__E_001350e8;
          puVar19[5] = local_228._m_expectedTimeForCompletion;
          __cxa_throw(puVar19,&EDeadline::typeinfo,E::~E);
        }
      }
      else {
        local_2b8 = local_2b8 * 2;
      }
    }
    pJVar10 = local_2a0;
    lVar15 = *(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                       super_BGIP_IncrementalSolverInterface.field_0x10;
    sVar3.px = *(element_type **)
                &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                 super_BGIP_IncrementalSolverInterface.field_0x8;
    sVar3.pn.pi_ = *(sp_counted_base **)
                    &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                     super_BGIP_IncrementalSolverInterface.field_0x10;
    if (lVar15 != 0) {
      LOCK();
      piVar1 = (int *)(lVar15 + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_1b8 = sVar3;
    if (uVar14 == 0) {
      dVar26 = 0.0;
    }
    else {
      uVar20 = 0;
      auVar28 = ZEXT864(0) << 0x40;
      do {
        uVar23 = (**(code **)(*(long *)sVar3.px + 0x68))(sVar3.px,uVar20);
        uVar12 = (**(code **)(*(long *)pJVar10 + 0x88))(pJVar10,uVar20);
        in_RCX = *(undefined8 **)sVar3.px;
        auVar25._0_8_ = (*(code *)in_RCX[0x10])(sVar3.px,uVar20,uVar12);
        auVar25._8_56_ = extraout_var;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar23;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auVar28._0_8_;
        auVar7 = vfmadd213sd_fma(auVar25._0_16_,auVar27,auVar4);
        dVar26 = auVar7._0_8_;
        uVar20 = (ulong)((int)uVar20 + 1);
        auVar28 = ZEXT1664(auVar7);
      } while (uVar20 < uVar14);
    }
    this = local_290;
    if ((local_2c0 < dVar26) &&
       (JointPolicyPureVector::operator=(local_288,local_2a0), local_2c0 = dVar26,
       (this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
       super_BGIP_IncrementalSolverInterface.field_0xc8 == '\x01')) {
      tVar29.tv_usec = local_270;
      tVar29.tv_sec = local_268;
      tVar30.tv_usec = (__suseconds_t)in_RCX;
      tVar30.tv_sec = extraout_RDX;
      dVar24 = (double)TimeTools::GetDeltaTimeDouble(tVar29,tVar30);
      poVar18 = std::ostream::_M_insert<double>(dVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\t",1);
      poVar18 = std::ostream::_M_insert<double>(dVar24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\t",1);
    }
    if ((uVar5 != 1) || (dVar26 < this->_m_CBGupperBound + -1e-12)) {
      if (1 < uVar5) {
        BGIPSolution::AddSolution((JointPolicyPureVector *)puVar2,dVar26);
      }
      uVar13 = JPolComponent_VectorImplementation::Increment();
      bVar9 = true;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Hit CBG upperbound",0x12);
      in_RCX = &std::cout;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      BGIPSolution::AddSolution((JointPolicyPureVector *)puVar2,dVar26);
      bVar9 = false;
      local_260 = dVar26;
    }
    local_2d0 = local_260;
    uVar21 = uVar21 + 1;
    boost::detail::shared_count::~shared_count(&local_1b8.pn);
  } while (bVar9);
  boost::detail::shared_count::~shared_count(&local_280);
  boost::detail::shared_count::~shared_count(&local_298);
  return local_2d0;
}

Assistant:

double Solve()
    {    
        _m_solved = true;
        struct timeval start_time, cur_time;
        if(gettimeofday(&start_time, NULL) != 0)
            throw "Error with gettimeofday";

        tms ts_before, ts_after;
        times(&ts_before);
        LIndex checkPointForDeadline = 1000000;

        bool round = false;

        boost::shared_ptr<JP> jpol = 
            boost::dynamic_pointer_cast<JP>(this->GetNewJpol());
        boost::shared_ptr<JP> best = 
            boost::dynamic_pointer_cast<JP>(this->GetNewJpol());

        double v_best = -DBL_MAX;
        double v = 0.0;

        int i = 0;
        if(DEBUG_BGIP_SOLVER_BFS)
            std::cout<<"Starting Bruteforce search - v_best is init to "<<v_best<<std::endl;
#if DEBUG_BGIP_SOLVER_BFS_PRINTOUTPROGRESS
        LIndex nrJPols = this->GetBGIPI()->GetNrJointPolicies();
#endif

        size_t nrJT = this->GetBGIPI()->
            GetNrJointTypes();
        size_t nrDesiredSolutions = this->GetNrDesiredSolutions();
        
        while(!round)
        {
            if(DEBUG_BGIP_SOLVER_BFS){std::cout << "Jpol#"<< i << " - ";}
#if DEBUG_BGIP_SOLVER_BFS_PRINTOUTPROGRESS
            if(i % 1000 == 0&& i > 1000)
            {
                std::cout << "Jpol #"<< i << " of " << nrJPols<< " - ";
                printf("%.4f", ((double)i / nrJPols) * 100 );
                std::cout << "%" << std::endl;
            }
#endif
            //this checks whether BFS has used more time then allowed 
            //(the deadline) and throws an exception if it has.
            if(_m_deadlineInSeconds && (i % checkPointForDeadline) == 0)
            {
                times(&ts_after);
                clock_t utime = ts_after.tms_utime -
                    ts_before.tms_utime;
                double timeSpentInS = static_cast<double>(utime) / sysconf(_SC_CLK_TCK);

                // we don't want to base our estimate on too few
                // time, so make it run at least 2s
                if(timeSpentInS < 2)
                    checkPointForDeadline *= 2;
                else
                {
                    LIndex nrJPols = this->
                        GetBGIPI()->GetNrJointPolicies();
                    double expectedTimeNeeded=
                        (CastLIndexToDouble(nrJPols)/
                         CastLIndexToDouble(checkPointForDeadline))*
                        timeSpentInS;
                    if(expectedTimeNeeded > (1.5*_m_deadlineInSeconds))
                    {
                        std::stringstream ss;
                        ss << "BGIP_SolverBruteForceSearch::Solve after " 
                           << checkPointForDeadline
                           << " we spent " << timeSpentInS << "s, for all " << nrJPols
                           << " jpols we expect to take " << expectedTimeNeeded
                           << "s, which is above the deadline (>1.5*" 
                           << _m_deadlineInSeconds << "s), bailing out";
                        EDeadline e(ss.str(),expectedTimeNeeded);
                        throw(e);
                    }
                }
            }
            ++i;
            
            v = 0.0;

            JP *jpolRawPtr = jpol.get();
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> 
                bgip= this->GetBGIPI();
            const BayesianGameIdenticalPayoffInterface *bgipRawPtr=
                bgip.get();
            for(Index jt = 0; jt < nrJT; ++jt)
            {
                double P_jt = bgipRawPtr->GetProbability(jt);
                Index ja = jpolRawPtr->GetJointActionIndex(jt);  
                v += P_jt * bgipRawPtr->GetUtility(jt, ja);
            }

            if(DEBUG_BGIP_SOLVER_BFS) std::cout << "Expected value = "<< v;
            if(v > v_best)
            {
                if(DEBUG_BGIP_SOLVER_BFS) std::cout << " -> new best policy!!!";
                v_best = v;
                *best = *jpol; 
                if(this->GetWriteAnyTimeResults()){
                    double delta  = TimeTools::GetDeltaTimeDouble(start_time, cur_time);
                    (*this->GetResultsOFStream()) << v_best << "\t";
                    (*this->GetTimingsOFStream()) << delta << "\t";
                }
            }

            if(nrDesiredSolutions == 1 &&
               (v >= (_m_CBGupperBound-PROB_PRECISION)))
            {
                std::cout << "Hit CBG upperbound" << std::endl;
                this->AddSolution( *jpol, v );
                return(v);
                break;
            }

            // if we want more than just the single best solution, try to add all to the solution
            if(nrDesiredSolutions>1)
            {
                this->AddSolution( *jpol, v );
//                      std::cout << "added solution with value " << v << ", best is "
//                                << this->GetPayoff() << std::endl;
//                      std::cout << this->GetSolution().SoftPrint();
            }
            if(DEBUG_BGIP_SOLVER_BFS) {    
                std::cout <<  std::endl << "Incrementing joint policy..."<<std::endl; 
            }    
            round = ++(*jpol);
        }
        //end the line in the results file
        if(this->GetWriteAnyTimeResults()){
            (*this->GetResultsOFStream()) << std::endl;
            (*this->GetTimingsOFStream()) << std::endl;
        } 

        // if _m_nrSolutions>1 then we already added this to the queue
        if(nrDesiredSolutions == 1)
            this->AddSolution( *best, v_best );

        return(v_best);
    }